

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::removeWidget(NavigationBar *this,QWidget *widget)

{
  int iVar1;
  NavigationBarPrivate *pNVar2;
  int index;
  QWidget *widget_local;
  NavigationBar *this_local;
  
  pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  iVar1 = QStackedWidget::indexOf((QWidget *)pNVar2->stack);
  if (iVar1 != -1) {
    pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    NavigationBarPrivate::removeWidget(pNVar2,widget);
    pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    QList<int>::clear(&(pNVar2->backStack).super_QList<int>);
    pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    QList<int>::clear(&(pNVar2->forwardStack).super_QList<int>);
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::hide();
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::hide();
  }
  return;
}

Assistant:

void
NavigationBar::removeWidget( QWidget * widget )
{
	const int index = d->stack->indexOf( widget );

	if( index != -1 )
	{
		d->removeWidget( widget );

		d->backStack.clear();
		d->forwardStack.clear();

		d->left->hide();
		d->right->hide();
	}
}